

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void keep_least_weights(vector<double,_std::allocator<double>_> *old_weights,
                       vector<double,_std::allocator<double>_> *new_weights)

{
  double dVar1;
  value_type vVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  undefined4 local_1c;
  uint i;
  vector<double,_std::allocator<double>_> *new_weights_local;
  vector<double,_std::allocator<double>_> *old_weights_local;
  
  local_1c = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(old_weights);
    if (sVar3 <= local_1c) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](old_weights,(ulong)local_1c);
    dVar1 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](new_weights,(ulong)local_1c);
    if (*pvVar5 <= dVar1 && dVar1 != *pvVar5) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](new_weights,(ulong)local_1c)
      ;
      vVar2 = *pvVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](old_weights,(ulong)local_1c)
      ;
      *pvVar4 = vVar2;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void keep_least_weights(std::vector<double>& old_weights, const std::vector<double>& new_weights){
    // std::cout<<" dbg size comparison: "<<old_weights.size()<<" vs "<<new_weights.size()<<'\n';
    // std::cout<<" dbg new weights: ";
    for(unsigned i=0;i<old_weights.size();++i){
        // std::cout<<" \ndbg check if "<<old_weights[i]<<" > "<<new_weights[i]<<" ? => ";
        if(old_weights[i]>new_weights[i]){
            old_weights[i]=new_weights[i];
        }
        // std::cout<<old_weights[i]<<" ";
    }
    // std::cout<<'\n';
}